

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O2

int __thiscall
TPZMatrix<float>::GetSub
          (TPZMatrix<float> *this,int64_t sRow,int64_t sCol,int64_t rowSize,int64_t colSize,
          TPZFMatrix<float> *A)

{
  int iVar1;
  int64_t c;
  long lVar2;
  long lVar3;
  undefined1 local_44 [4];
  int64_t local_40;
  long local_38;
  
  local_40 = sRow;
  if ((rowSize + sRow <= (this->super_TPZBaseMatrix).fRow) &&
     (colSize + sCol <= (this->super_TPZBaseMatrix).fCol)) {
    (*(A->super_TPZMatrix<float>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xd])
              (A,rowSize,colSize);
    lVar3 = 0;
    if (colSize < 1) {
      colSize = lVar3;
    }
    local_38 = rowSize;
    if (rowSize < 1) {
      local_38 = lVar3;
    }
    for (; lVar3 != local_38; lVar3 = lVar3 + 1) {
      for (lVar2 = 0; colSize != lVar2; lVar2 = lVar2 + 1) {
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                  (this,local_40,sCol + lVar2);
        (*(A->super_TPZMatrix<float>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0x23])
                  (A,lVar3,lVar2,local_44);
      }
      local_40 = local_40 + 1;
    }
    return 1;
  }
  iVar1 = Error("GetSub <t.he sub-matrix is too big>",(char *)0x0);
  return iVar1;
}

Assistant:

int TPZMatrix<TVar>::GetSub(const int64_t sRow,const int64_t sCol,const int64_t rowSize,
							const int64_t colSize, TPZFMatrix<TVar> & A ) const {
    if ( ((sRow + rowSize) > Rows()) || ((sCol + colSize) > Cols()) ) {
        return( Error( "GetSub <t.he sub-matrix is too big>" ) );
    }
    A.Resize( rowSize, colSize );
    int64_t row = sRow;
    for ( int64_t r = 0; r < rowSize; r++, row++ ) {
        int64_t col = sCol;
        for ( int64_t c = 0; c < colSize; c++, col++ ) {
            A.PutVal( r, c, GetVal( row, col ) );
        }
    }
    return( 1 );
}